

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandProcessHadOutput
          (BuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle,StringRef data)

{
  void *pvVar1;
  value_type *pvVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  uint64_t local_30;
  
  pvVar1 = this->impl;
  local_40._M_device = (mutex_type *)((long)pvVar1 + 0x50);
  local_40._M_owns = false;
  local_30 = handle.id;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  pvVar2 = llvm::
           DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)((long)pvVar1 + 0x38),&local_30);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             &(pvVar2->
              super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ).second,
             (pvVar2->
             super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             .second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,data.Data,data.Data + data.Length);
  if (local_40._M_owns == true) {
    std::unique_lock<std::mutex>::unlock(&local_40);
  }
  return;
}

Assistant:

void BuildSystemFrontendDelegate::
commandProcessHadOutput(Command* command, ProcessHandle handle,
                        StringRef data) {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  std::unique_lock<std::mutex> lock(impl->processOutputBuffersMutex);

  // Append to the output buffer.
  auto& buffer = impl->processOutputBuffers[handle.id];
  buffer.insert(buffer.end(), data.begin(), data.end());
}